

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanMemoryPage::Free(VulkanMemoryPage *this,VulkanMemoryAllocation *Allocation)

{
  char (*pacVar1) [83];
  char (*pacVar2) [72];
  char (*Args_1) [83];
  Char *pCVar3;
  char (*Args_1_00) [72];
  VulkanMemoryAllocation local_88;
  undefined1 local_70 [8];
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  lock_guard<std::mutex> Lock;
  VulkanMemoryAllocation *Allocation_local;
  VulkanMemoryPage *this_local;
  
  VulkanMemoryManager::OnFreeAllocation
            (this->m_ParentMemoryMgr,Allocation->Size,this->m_CPUMemory != (void *)0x0);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)((long)&msg.field_2 + 8),&this->m_Mutex);
  pacVar1 = (char (*) [83])Allocation->UnalignedOffset;
  Args_1 = (char (*) [83])std::numeric_limits<unsigned_long>::max();
  if (Args_1 < pacVar1) {
    Diligent::FormatString<char[26],char[83]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Allocation.UnalignedOffset <= std::numeric_limits<AllocationsMgrOffsetType>::max()",
               Args_1);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar3,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0x7b);
    std::__cxx11::string::~string((string *)local_40);
  }
  pacVar2 = (char (*) [72])Allocation->Size;
  Args_1_00 = (char (*) [72])std::numeric_limits<unsigned_long>::max();
  if (Args_1_00 < pacVar2) {
    Diligent::FormatString<char[26],char[72]>
              ((string *)local_70,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Allocation.Size <= std::numeric_limits<AllocationsMgrOffsetType>::max()",Args_1_00);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar3,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0x7c);
    std::__cxx11::string::~string((string *)local_70);
  }
  Diligent::VariableSizeAllocationsManager::Free
            (&this->m_AllocationMgr,Allocation->UnalignedOffset,Allocation->Size);
  VulkanMemoryAllocation::VulkanMemoryAllocation(&local_88);
  VulkanMemoryAllocation::operator=(Allocation,&local_88);
  VulkanMemoryAllocation::~VulkanMemoryAllocation(&local_88);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)((long)&msg.field_2 + 8));
  return;
}

Assistant:

void VulkanMemoryPage::Free(VulkanMemoryAllocation&& Allocation)
{
    m_ParentMemoryMgr.OnFreeAllocation(Allocation.Size, m_CPUMemory != nullptr);
    std::lock_guard<std::mutex> Lock{m_Mutex};
    VERIFY_EXPR(Allocation.UnalignedOffset <= std::numeric_limits<AllocationsMgrOffsetType>::max());
    VERIFY_EXPR(Allocation.Size <= std::numeric_limits<AllocationsMgrOffsetType>::max());
    m_AllocationMgr.Free(static_cast<AllocationsMgrOffsetType>(Allocation.UnalignedOffset), static_cast<AllocationsMgrOffsetType>(Allocation.Size));
    Allocation = VulkanMemoryAllocation{};
}